

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O3

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMesh(CXMeshFileLoader *this,SXMesh *mesh)

{
  uint uVar1;
  array<unsigned_short> *this_00;
  array<unsigned_int> *this_01;
  array<irr::core::vector2d<float>_> *this_02;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer puVar4;
  ushort uVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  bool bVar8;
  u32 uVar9;
  u32 uVar10;
  int iVar11;
  u32 uVar12;
  u32 uVar13;
  float fVar14;
  undefined4 extraout_var;
  vector2d<float> *pvVar15;
  undefined7 uVar18;
  void *pvVar16;
  pointer pSVar17;
  pointer pSVar19;
  u32 f;
  ulong uVar20;
  char *this_03;
  byte bVar21;
  long lVar22;
  byte bVar23;
  ushort uVar24;
  uint uVar25;
  SXMesh *pSVar26;
  array<irr::video::S3DVertex> *this_04;
  ulong uVar27;
  vector2d<float> *element;
  short sVar28;
  void *pvVar29;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar30;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar31;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  stringc objectName;
  array<unsigned_int> polygonfaces;
  stringc name;
  ulong local_108;
  short local_100;
  short local_f8;
  string<char> local_e0;
  long local_c0;
  SXMesh *local_b8;
  long local_b0;
  string<char> local_a8;
  string<char> local_88;
  undefined8 local_60;
  undefined8 local_58;
  stringc local_50;
  
  local_50.str._M_dataplus._M_p = (pointer)&local_50.str.field_2;
  local_50.str._M_string_length = 0;
  local_50.str.field_2._M_local_buf[0] = '\0';
  bVar7 = readHeadOfDataObject(this,&local_50);
  if (bVar7) {
    uVar9 = readInt(this);
    this_04 = &mesh->Vertices;
    local_b8 = mesh;
    ::std::vector<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>::resize
              ((vector<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_> *)this_04,
               (ulong)uVar9);
    if (uVar9 != 0) {
      pSVar17 = (this_04->m_data).
                super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar22 = 0;
      do {
        readVector3(this,(vector3df *)((long)&pSVar17->Pos + lVar22));
        pSVar17 = (this_04->m_data).
                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pSVar17->Normal + lVar22) = 0;
        *(undefined8 *)((long)&pSVar17->Normal + lVar22 + 8U) = 0xffffffff00000000;
        lVar22 = lVar22 + 0x24;
      } while ((ulong)uVar9 * 0x24 != lVar22);
    }
    bVar7 = checkForTwoFollowingSemicolons(this);
    pSVar26 = local_b8;
    if (!bVar7) {
      os::Printer::log((Printer *)"No finishing semicolon in Mesh Vertex Array found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      core::string<char>::string(&local_88,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
        operator_delete(local_88.str._M_dataplus._M_p,local_88.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
    uVar9 = readInt(this);
    this_01 = &pSVar26->Indices;
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this_01->m_data,(ulong)(uVar9 * 3));
    this_00 = &pSVar26->IndexCountPerFace;
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&this_00->m_data,(ulong)uVar9);
    uVar30 = 0;
    uVar31 = 0;
    local_88.str._M_dataplus._M_p = (pointer)0x0;
    local_88.str._M_string_length = 0;
    local_88.str.field_2._M_allocated_capacity = 0;
    local_88.str.field_2._M_local_buf[8] = '\x01';
    if (uVar9 != 0) {
      uVar27 = 0;
      uVar25 = 0;
      do {
        uVar10 = readInt(this);
        if (uVar10 == 3) {
          uVar10 = readInt(this);
          (this_01->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar25] = uVar10;
          uVar10 = readInt(this);
          uVar1 = uVar25 + 2;
          (this_01->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar25 + 1] = uVar10;
          uVar10 = readInt(this);
          uVar25 = uVar25 + 3;
          (this_01->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1] = uVar10;
          (this_00->m_data).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar27] = 3;
          uVar30 = extraout_XMM0_Da_03;
          uVar31 = extraout_XMM0_Db_03;
        }
        else {
          if (uVar10 < 3) {
            os::Printer::log((Printer *)"Invalid face count (<3) found in Mesh x file reader.",
                             (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
            core::string<char>::string(&local_a8,this->Line);
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8.str._M_dataplus._M_p != &local_a8.str.field_2) {
              operator_delete(local_a8.str._M_dataplus._M_p,
                              local_a8.str.field_2._M_allocated_capacity + 1);
            }
            this->ErrorState = true;
            bVar7 = false;
            goto LAB_001b92bf;
          }
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,(ulong)uVar10)
          ;
          pSVar26 = local_b8;
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (&this_01->m_data,
                     (ulong)(((int)((ulong)((long)(local_b8->Indices).m_data.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(local_b8->Indices).m_data.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) +
                             uVar10 * 3) - 9));
          _Var6._M_p = local_88.str._M_dataplus._M_p;
          (pSVar26->IndexCountPerFace).m_data.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[uVar27] = (short)uVar10 * 3 - 6;
          uVar20 = 0;
          do {
            uVar12 = readInt(this);
            *(u32 *)(_Var6._M_p + uVar20 * 4) = uVar12;
            uVar20 = uVar20 + 1;
          } while (uVar10 != uVar20);
          puVar4 = (this_01->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar22 = 2;
          do {
            puVar4[uVar25] = *(uint *)_Var6._M_p;
            uVar1 = uVar25 + 2;
            puVar4[uVar25 + 1] = *(uint *)(_Var6._M_p + lVar22 * 4 + -4);
            uVar25 = uVar25 + 3;
            puVar4[uVar1] = *(uint *)(_Var6._M_p + lVar22 * 4);
            lVar2 = lVar22 - (ulong)(uVar10 - 2);
            lVar22 = lVar22 + 1;
            uVar30 = extraout_XMM0_Da_04;
            uVar31 = extraout_XMM0_Db_04;
          } while (lVar2 != 1);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar9);
    }
    pSVar26 = local_b8;
    puVar4 = (local_b8->Indices).m_data.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar27 = (ulong)((long)(local_b8->Indices).m_data.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar4) >> 2;
    if ((int)uVar27 != 0) {
      uVar20 = 0;
      do {
        if ((uint)((int)((ulong)((long)(local_b8->Vertices).m_data.
                                       super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_b8->Vertices).m_data.
                                      super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39)
            <= puVar4[uVar20]) {
          os::Printer::log((Printer *)"Out of range index found in Mesh x file reader.",
                           (double)CONCAT44(uVar31,uVar30));
          this->ErrorState = true;
          goto LAB_001b925e;
        }
        uVar20 = uVar20 + 1;
      } while ((uVar27 & 0xffffffff) != uVar20);
    }
    bVar7 = checkForTwoFollowingSemicolons(this);
    if (!bVar7) {
      os::Printer::log((Printer *)"No finishing semicolon in Mesh Face Array found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      core::string<char>::string(&local_a8,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.str._M_dataplus._M_p != &local_a8.str.field_2) {
        operator_delete(local_a8.str._M_dataplus._M_p,local_a8.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
    this_02 = &pSVar26->TCoords2;
    do {
      getNextToken(&local_a8,this);
      _Var6._M_p = local_a8.str._M_dataplus._M_p;
      if ((int)local_a8.str._M_string_length == 0) {
        this_03 = "Unexpected ending found in Mesh in x file.";
        uVar30 = extraout_XMM0_Da_07;
        uVar31 = extraout_XMM0_Db_07;
        goto LAB_001b8bac;
      }
      if ((*local_a8.str._M_dataplus._M_p == '}') && (local_a8.str._M_dataplus._M_p[1] == '\0')) {
        iVar11 = 0x18;
      }
      else {
        iVar11 = strcmp(local_a8.str._M_dataplus._M_p,"MeshNormals");
        if (iVar11 == 0) {
          bVar7 = parseDataObjectMeshNormals(this,pSVar26);
LAB_001b8c34:
          iVar11 = 1;
          if (bVar7 == false) goto LAB_001b8c3f;
        }
        else {
          iVar11 = strcmp(_Var6._M_p,"MeshTextureCoords");
          if (iVar11 == 0) {
            bVar7 = parseDataObjectMeshTextureCoords(this,pSVar26);
            goto LAB_001b8c34;
          }
          iVar11 = strcmp(_Var6._M_p,"MeshVertexColors");
          if (iVar11 == 0) {
            bVar7 = parseDataObjectMeshVertexColors(this,pSVar26);
            goto LAB_001b8c34;
          }
          iVar11 = strcmp(_Var6._M_p,"MeshMaterialList");
          if (iVar11 == 0) {
            bVar7 = parseDataObjectMeshMaterialList(this,pSVar26);
            goto LAB_001b8c34;
          }
          iVar11 = strcmp(_Var6._M_p,"VertexDuplicationIndices");
          if (iVar11 == 0) {
LAB_001b8b98:
            bVar7 = parseUnknownDataObject(this);
            goto LAB_001b8c34;
          }
          iVar11 = strcmp(_Var6._M_p,"DeclData");
          if (iVar11 != 0) {
            iVar11 = strcmp(_Var6._M_p,"FVFData");
            if (iVar11 == 0) {
              bVar7 = readHeadOfDataObject(this,(stringc *)0x0);
              if (bVar7) {
                uVar9 = readInt(this);
                uVar10 = readInt(this);
                pvVar15 = (vector2d<float> *)operator_new__((ulong)uVar10 * 4);
                if (uVar10 != 0) {
                  uVar27 = 0;
                  do {
                    fVar14 = (float)readInt(this);
                    (&pvVar15->X)[uVar27] = fVar14;
                    uVar27 = uVar27 + 1;
                  } while (uVar10 != uVar27);
                }
                if ((uVar9 & 0x102) != 0) {
                  core::array<irr::core::vector2d<float>_>::reallocate
                            (this_02,(int)((ulong)((long)(pSVar26->Vertices).m_data.
                                                                                                                  
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pSVar26->Vertices).m_data.
                                                                                                                
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                     0x38e38e39,true);
                  if ((int)((ulong)((long)(pSVar26->Vertices).m_data.
                                          super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pSVar26->Vertices).m_data.
                                         super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      0x38e38e39 != 0) {
                    uVar25 = 0;
                    element = pvVar15;
                    do {
                      core::array<irr::core::vector2d<float>_>::push_back(this_02,element);
                      element = (vector2d<float> *)((long)&element->X + (ulong)(uVar9 >> 5 & 0x78));
                      uVar25 = uVar25 + 1;
                    } while (uVar25 < (uint)((int)((ulong)((long)(pSVar26->Vertices).m_data.
                                                                                                                                  
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pSVar26->Vertices).m_data.
                                                                                                                
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                            0x38e38e39));
                  }
                }
                operator_delete__(pvVar15);
                bVar7 = checkForOneFollowingSemicolons(this);
                if (!bVar7) {
                  os::Printer::log((Printer *)"No finishing semicolon in FVFData found.",
                                   (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
                  core::string<char>::string(&local_e0,this->Line);
                  os::Printer::log((double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e0.str._M_dataplus._M_p != &local_e0.str.field_2) {
                    operator_delete(local_e0.str._M_dataplus._M_p,
                                    local_e0.str.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar7 = checkForClosingBrace(this);
                if (bVar7) goto LAB_001b8c3d;
                this_03 = "No closing brace in FVFData found in x file";
                uVar30 = extraout_XMM0_Da_14;
                uVar31 = extraout_XMM0_Db_14;
              }
              else {
                this_03 = "No starting brace in FVFData found.";
                uVar30 = extraout_XMM0_Da_11;
                uVar31 = extraout_XMM0_Db_11;
              }
LAB_001b8bac:
              os::Printer::log((Printer *)this_03,(double)CONCAT44(uVar31,uVar30));
              core::string<char>::string(&local_e0,this->Line);
              os::Printer::log((double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0.str._M_dataplus._M_p != &local_e0.str.field_2) {
                operator_delete(local_e0.str._M_dataplus._M_p,
                                local_e0.str.field_2._M_allocated_capacity + 1);
              }
LAB_001b8bf0:
              this->ErrorState = true;
              iVar11 = 1;
              goto LAB_001b8c3f;
            }
            iVar11 = strcmp(_Var6._M_p,"XSkinMeshHeader");
            if (iVar11 == 0) {
              bVar7 = parseDataObjectSkinMeshHeader(this,pSVar26);
            }
            else {
              iVar11 = strcmp(_Var6._M_p,"SkinWeights");
              if (iVar11 != 0) {
                os::Printer::log((double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
                goto LAB_001b8b98;
              }
              bVar7 = parseDataObjectSkinWeights(this,pSVar26);
            }
            goto LAB_001b8c34;
          }
          bVar7 = readHeadOfDataObject(this,(stringc *)0x0);
          if (!bVar7) {
            this_03 = "No starting brace in DeclData found.";
            uVar30 = extraout_XMM0_Da_10;
            uVar31 = extraout_XMM0_Db_10;
            goto LAB_001b8bac;
          }
          uVar9 = readInt(this);
          if (uVar9 == 0) {
            uVar5 = 0xffff;
            local_108 = 0;
            local_b0 = CONCAT62(local_b0._2_6_,0xffff);
            local_c0 = CONCAT62(local_c0._2_6_,0xffff);
            local_60 = 0;
            local_58 = 0;
            bVar7 = false;
          }
          else {
            local_100 = -1;
            uVar24 = 0;
            local_f8 = -1;
            local_108._0_2_ = -1;
            local_c0 = CONCAT62(local_c0._2_6_,0xffff);
            local_b0 = CONCAT62(local_b0._2_6_,0xffff);
            uVar5 = 0xffff;
            do {
              uVar10 = readInt(this);
              readInt(this);
              uVar12 = readInt(this);
              uVar13 = readInt(this);
              lVar22 = CONCAT44(extraout_var,uVar13);
              sVar28 = (short)uVar10;
              if (uVar12 == 5) {
                if (uVar13 == 1) {
                  local_c0 = CONCAT62(local_c0._2_6_,uVar24);
                  local_100 = sVar28;
                }
                else if (uVar13 == 0) {
                  local_b0 = CONCAT62(local_b0._2_6_,uVar24);
                  local_f8 = sVar28;
                }
              }
              else if (uVar12 == 3) {
                local_108._0_2_ = sVar28;
                uVar5 = uVar24;
              }
              if (uVar10 < 0x11) {
                lVar22 = (long)&switchD_001b8d2c::switchdataD_0022abe0 +
                         (long)(int)(&switchD_001b8d2c::switchdataD_0022abe0)[uVar10];
                switch(uVar10) {
                default:
                  uVar24 = uVar24 + 4;
                  break;
                case 1:
                case 7:
                case 10:
                case 0xc:
                case 0x10:
                  uVar24 = uVar24 + 8;
                  break;
                case 2:
                  uVar24 = uVar24 + 0xc;
                  break;
                case 3:
                  uVar24 = uVar24 + 0x10;
                }
              }
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
            bVar7 = local_100 == 1;
            uVar18 = (undefined7)((ulong)lVar22 >> 8);
            local_60 = CONCAT71(uVar18,(short)local_108 == 2);
            local_58 = CONCAT71(uVar18,local_f8 == 1);
            local_108 = (ulong)uVar24;
            pSVar26 = local_b8;
          }
          uVar9 = readInt(this);
          pvVar16 = operator_new__((ulong)uVar9 * 4);
          if (uVar9 != 0) {
            uVar27 = 0;
            do {
              uVar10 = readInt(this);
              *(u32 *)((long)pvVar16 + uVar27 * 4) = uVar10;
              uVar27 = uVar27 + 1;
            } while (uVar9 != uVar27);
          }
          bVar8 = checkForOneFollowingSemicolons(this);
          paVar3 = &local_e0.str.field_2;
          if (!bVar8) {
            os::Printer::log((Printer *)"No finishing semicolon in DeclData found.",
                             (double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15));
            core::string<char>::string(&local_e0,this->Line);
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0.str._M_dataplus._M_p != paVar3) {
              operator_delete(local_e0.str._M_dataplus._M_p,
                              local_e0.str.field_2._M_allocated_capacity + 1);
            }
          }
          bVar8 = checkForClosingBrace(this);
          if (!bVar8) {
            os::Printer::log((Printer *)"No closing brace in DeclData.",
                             (double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17));
            core::string<char>::string(&local_e0,this->Line);
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0.str._M_dataplus._M_p != paVar3) {
              operator_delete(local_e0.str._M_dataplus._M_p,
                              local_e0.str.field_2._M_allocated_capacity + 1);
            }
            operator_delete__(pvVar16);
            goto LAB_001b8bf0;
          }
          bVar7 = (bool)((short)local_c0 != -1 & bVar7);
          if (bVar7) {
            core::array<irr::core::vector2d<float>_>::reallocate
                      (this_02,(int)((ulong)((long)(pSVar26->Vertices).m_data.
                                                                                                      
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(pSVar26->Vertices).m_data.
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                               0x38e38e39,true);
          }
          pSVar17 = (pSVar26->Vertices).m_data.
                    super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar19 = (pSVar26->Vertices).m_data.
                    super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((int)((ulong)((long)pSVar19 - (long)pSVar17) >> 2) * 0x38e38e39 != 0) {
            bVar23 = uVar5 != 0xffff & (byte)local_60;
            bVar21 = (short)local_b0 != -1 & (byte)local_58;
            local_b0 = (long)(short)local_b0;
            local_c0 = (long)(short)local_c0;
            lVar22 = 0x1c;
            uVar27 = 0;
            pvVar29 = pvVar16;
            do {
              if (bVar23 != 0) {
                *(undefined8 *)((long)pSVar17 + lVar22 + -0x10) =
                     *(undefined8 *)((long)pvVar29 + (long)(short)uVar5);
                *(undefined4 *)((long)pSVar17 + lVar22 + -8) =
                     *(undefined4 *)((long)pvVar29 + (long)(short)uVar5 + 8);
              }
              if (bVar21 != 0) {
                *(undefined8 *)((long)&(pSVar17->Pos).X + lVar22) =
                     *(undefined8 *)((long)pvVar29 + local_b0);
              }
              if (bVar7) {
                core::array<irr::core::vector2d<float>_>::push_back
                          (this_02,(vector2d<float> *)((long)pvVar29 + local_c0));
                pSVar17 = (local_b8->Vertices).m_data.
                          super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pSVar19 = (local_b8->Vertices).m_data.
                          super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              pvVar29 = (void *)((long)pvVar29 + local_108);
              uVar27 = uVar27 + 1;
              lVar22 = lVar22 + 0x24;
            } while (uVar27 < (uint)((int)((ulong)((long)pSVar19 - (long)pSVar17) >> 2) * 0x38e38e39
                                    ));
          }
          operator_delete__(pvVar16);
          pSVar26 = local_b8;
        }
LAB_001b8c3d:
        iVar11 = 0;
      }
LAB_001b8c3f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.str._M_dataplus._M_p != &local_a8.str.field_2) {
        operator_delete(local_a8.str._M_dataplus._M_p,local_a8.str.field_2._M_allocated_capacity + 1
                       );
      }
    } while (iVar11 == 0);
    if (iVar11 == 0x18) {
      bVar7 = true;
    }
    else {
LAB_001b925e:
      bVar7 = false;
    }
LAB_001b92bf:
    if ((uint *)local_88.str._M_dataplus._M_p != (uint *)0x0) {
      operator_delete(local_88.str._M_dataplus._M_p,
                      local_88.str.field_2._M_allocated_capacity -
                      (long)local_88.str._M_dataplus._M_p);
    }
  }
  else {
    os::Printer::log((Printer *)"No opening brace in Mesh found in x file",
                     (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    core::string<char>::string(&local_88,this->Line);
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
      operator_delete(local_88.str._M_dataplus._M_p,local_88.str.field_2._M_allocated_capacity + 1);
    }
    this->ErrorState = true;
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
    operator_delete(local_50.str._M_dataplus._M_p,
                    CONCAT71(local_50.str.field_2._M_allocated_capacity._1_7_,
                             local_50.str.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMesh(SXMesh &mesh)
{
	core::stringc name;

	if (!readHeadOfDataObject(&name)) {
#ifdef _XREADER_DEBUG
		os::Printer::log("CXFileReader: Reading mesh", ELL_DEBUG);
#endif
		os::Printer::log("No opening brace in Mesh found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: Reading mesh", name.c_str(), ELL_DEBUG);
#endif

	// read vertex count
	const u32 nVertices = readInt();

	// read vertices
	mesh.Vertices.set_used(nVertices);
	for (u32 n = 0; n < nVertices; ++n) {
		readVector3(mesh.Vertices[n].Pos);
		mesh.Vertices[n].Color = 0xFFFFFFFF;
		mesh.Vertices[n].Normal = core::vector3df(0.0f);
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Vertex Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	// read faces
	const u32 nFaces = readInt();

	mesh.Indices.set_used(nFaces * 3);
	mesh.IndexCountPerFace.set_used(nFaces);

	core::array<u32> polygonfaces;
	u32 currentIndex = 0;

	for (u32 k = 0; k < nFaces; ++k) {
		const u32 fcnt = readInt();

		if (fcnt != 3) {
			if (fcnt < 3) {
				os::Printer::log("Invalid face count (<3) found in Mesh x file reader.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			// read face indices
			polygonfaces.set_used(fcnt);
			u32 triangles = (fcnt - 2);
			mesh.Indices.set_used(mesh.Indices.size() + ((triangles - 1) * 3));
			mesh.IndexCountPerFace[k] = (u16)(triangles * 3);

			for (u32 f = 0; f < fcnt; ++f)
				polygonfaces[f] = readInt();

			for (u32 jk = 0; jk < triangles; ++jk) {
				mesh.Indices[currentIndex++] = polygonfaces[0];
				mesh.Indices[currentIndex++] = polygonfaces[jk + 1];
				mesh.Indices[currentIndex++] = polygonfaces[jk + 2];
			}

			// TODO: change face indices in material list
		} else {
			mesh.Indices[currentIndex++] = readInt();
			mesh.Indices[currentIndex++] = readInt();
			mesh.Indices[currentIndex++] = readInt();
			mesh.IndexCountPerFace[k] = 3;
		}
	}

	for (u32 j = 0; j < mesh.Indices.size(); j++) {
		if (mesh.Indices[j] >= mesh.Vertices.size()) {
			os::Printer::log("Out of range index found in Mesh x file reader.", ELL_WARNING);
			SET_ERR_AND_RETURN();
		}
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Face Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	// here, other data objects may follow

	while (true) {
		core::stringc objectName = getNextToken();

		if (objectName.size() == 0) {
			os::Printer::log("Unexpected ending found in Mesh in x file.", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		} else if (objectName == "}") {
			break; // mesh finished
		}

#ifdef _XREADER_DEBUG
		os::Printer::log("debug DataObject in mesh", objectName.c_str(), ELL_DEBUG);
#endif

		if (objectName == "MeshNormals") {
			if (!parseDataObjectMeshNormals(mesh))
				return false;
		} else if (objectName == "MeshTextureCoords") {
			if (!parseDataObjectMeshTextureCoords(mesh))
				return false;
		} else if (objectName == "MeshVertexColors") {
			if (!parseDataObjectMeshVertexColors(mesh))
				return false;
		} else if (objectName == "MeshMaterialList") {
			if (!parseDataObjectMeshMaterialList(mesh))
				return false;
		} else if (objectName == "VertexDuplicationIndices") {
			// we'll ignore vertex duplication indices
			// TODO: read them
			if (!parseUnknownDataObject())
				return false;
		} else if (objectName == "DeclData") {
			if (!readHeadOfDataObject()) {
				os::Printer::log("No starting brace in DeclData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
			// arbitrary vertex attributes
			// first comes the number of element definitions
			// then the vertex element type definitions
			// with format type;tesselator;semantics;usageindex
			// we want to support 2;0;6;0 == tangent
			//                    2;0;7;0 == binormal
			//                    2;0;3;0 == normal
			//                  1/2;0;5;0 == 1st uv coord
			// and              1/2;0;5;1 == 2nd uv coord
			// type==2 is 3xf32, type==1 is 2xf32
			u32 j;
			const u32 dcnt = readInt();
			u16 size = 0;
			s16 normalpos = -1;
			s16 uvpos = -1;
			s16 uv2pos = -1;
			s16 tangentpos = -1;
			s16 binormalpos = -1;
			s16 normaltype = -1;
			s16 uvtype = -1;
			s16 uv2type = -1;
			s16 tangenttype = -1;
			s16 binormaltype = -1;

			(void)tangentpos;   // disable unused variable warnings
			(void)binormalpos;  // disable unused variable warnings
			(void)tangenttype;  // disable unused variable warnings
			(void)binormaltype; // disable unused variable warnings

			for (j = 0; j < dcnt; ++j) {
				const u32 type = readInt();
				// const u32 tesselator = readInt();
				readInt();
				const u32 semantics = readInt();
				const u32 index = readInt();
				switch (semantics) {
				case 3:
					normalpos = size;
					normaltype = type;
					break;
				case 5:
					if (index == 0) {
						uvpos = size;
						uvtype = type;
					} else if (index == 1) {
						uv2pos = size;
						uv2type = type;
					}
					break;
				case 6:
					tangentpos = size;
					tangenttype = type;
					break;
				case 7:
					binormalpos = size;
					binormaltype = type;
					break;
				default:
					break;
				}
				switch (type) {
				case 0:
					size += 4;
					break;
				case 1:
					size += 8;
					break;
				case 2:
					size += 12;
					break;
				case 3:
					size += 16;
					break;
				case 4:
				case 5:
				case 6:
					size += 4;
					break;
				case 7:
					size += 8;
					break;
				case 8:
				case 9:
					size += 4;
					break;
				case 10:
					size += 8;
					break;
				case 11:
					size += 4;
					break;
				case 12:
					size += 8;
					break;
				case 13:
					size += 4;
					break;
				case 14:
					size += 4;
					break;
				case 15:
					size += 4;
					break;
				case 16:
					size += 8;
					break;
				}
			}
			const u32 datasize = readInt();
			u32 *data = new u32[datasize];
			for (j = 0; j < datasize; ++j)
				data[j] = readInt();

			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon in DeclData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}
			if (!checkForClosingBrace()) {
				os::Printer::log("No closing brace in DeclData.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				delete[] data;
				SET_ERR_AND_RETURN();
			}
			u8 *dataptr = (u8 *)data;
			if ((uv2pos != -1) && (uv2type == 1))
				mesh.TCoords2.reallocate(mesh.Vertices.size());
			for (j = 0; j < mesh.Vertices.size(); ++j) {
				if ((normalpos != -1) && (normaltype == 2))
					mesh.Vertices[j].Normal.set(*((core::vector3df *)(dataptr + normalpos)));
				if ((uvpos != -1) && (uvtype == 1))
					mesh.Vertices[j].TCoords.set(*((core::vector2df *)(dataptr + uvpos)));
				if ((uv2pos != -1) && (uv2type == 1))
					mesh.TCoords2.push_back(*((core::vector2df *)(dataptr + uv2pos)));
				dataptr += size;
			}
			delete[] data;
		} else if (objectName == "FVFData") {
			if (!readHeadOfDataObject()) {
				os::Printer::log("No starting brace in FVFData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
			const u32 dataformat = readInt();
			const u32 datasize = readInt();
			u32 *data = new u32[datasize];
			for (u32 j = 0; j < datasize; ++j)
				data[j] = readInt();
			if (dataformat & 0x102) { // 2nd uv set
				mesh.TCoords2.reallocate(mesh.Vertices.size());
				u8 *dataptr = (u8 *)data;
				const u32 size = ((dataformat >> 8) & 0xf) * sizeof(core::vector2df);
				for (u32 j = 0; j < mesh.Vertices.size(); ++j) {
					mesh.TCoords2.push_back(*((core::vector2df *)(dataptr)));
					dataptr += size;
				}
			}
			delete[] data;
			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon in FVFData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}
			if (!checkForClosingBrace()) {
				os::Printer::log("No closing brace in FVFData found in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
		} else if (objectName == "XSkinMeshHeader") {
			if (!parseDataObjectSkinMeshHeader(mesh))
				return false;
		} else if (objectName == "SkinWeights") {
			// mesh.SkinWeights.push_back(SXSkinWeight());
			// if (!parseDataObjectSkinWeights(mesh.SkinWeights.getLast()))
			if (!parseDataObjectSkinWeights(mesh))
				return false;
		} else {
			os::Printer::log("Unknown data object in mesh in x file", objectName.c_str(), ELL_WARNING);
			if (!parseUnknownDataObject())
				return false;
		}
	}

	return true;
}